

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O3

rt_vector_expr<viennamath::rt_expression_interface<double>_> *
viennamath::operator*
          (rt_vector_expr<viennamath::rt_expression_interface<double>_> *__return_storage_ptr__,
          ct_constant<8L> *lhs,rt_vector_expr<viennamath::rt_expression_interface<double>_> *rhs)

{
  int iVar1;
  rt_expression_interface<double> *prVar2;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int in_ECX;
  void *__child_stack;
  pointer prVar4;
  __fn *__fn;
  void *in_R8;
  ulong uVar5;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_50;
  
  __fn = (__fn *)((long)(rhs->
                        super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                        ).
                        super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(rhs->
                        super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                        ).
                        super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
  rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
            (__return_storage_ptr__,(size_type)__fn);
  prVar4 = (rhs->
           super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ).
           super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((rhs->
      super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
      ).
      super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != prVar4) {
    uVar5 = 0;
    do {
      prVar2 = (rt_expression_interface<double> *)operator_new(0x10);
      prVar2->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_001167a0;
      prVar2[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
      poVar3 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
      poVar3->_vptr_op_interface = (_func_int **)&PTR__op_interface_00116b20;
      iVar1 = (*(prVar4[uVar5].rt_expr_._M_ptr)->_vptr_rt_expression_interface[2])();
      local_50.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
      local_50.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_binary_expr_00116490;
      prVar4 = (__return_storage_ptr__->
               super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ).
               super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_50.lhs_._M_ptr = prVar2;
      local_50.op_._M_ptr = poVar3;
      iVar1 = rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                        (&local_50,__fn,__child_stack,in_ECX,in_R8);
      prVar2 = prVar4[uVar5].rt_expr_._M_ptr;
      if (prVar2 != (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar1)) {
        if (prVar2 != (rt_expression_interface<double> *)0x0) {
          (*prVar2->_vptr_rt_expression_interface[1])();
        }
        prVar4[uVar5].rt_expr_._M_ptr =
             (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar1);
      }
      local_50.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_binary_expr_00116490;
      if (local_50.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_50.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      if (local_50.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0)
      {
        (*(local_50.op_._M_ptr)->_vptr_op_interface[1])();
      }
      if (local_50.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_50.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      uVar5 = uVar5 + 1;
      prVar4 = (rhs->
               super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ).
               super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(rhs->
                                   super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                                   ).
                                   super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)prVar4 >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

rt_vector_expr<InterfaceType> operator*(T const & lhs, rt_vector_expr<InterfaceType> const & rhs)
  {
    rt_vector_expr<InterfaceType> result(rhs.size());
    for (std::size_t i=0; i<rhs.size(); ++i)
      result[i] = lhs * rhs[i];

    return result;
  }